

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::write_data(Stream *strm,char *d,size_t l)

{
  int iVar1;
  int extraout_var;
  ssize_t length;
  size_t offset;
  size_t l_local;
  char *d_local;
  Stream *strm_local;
  
  length = 0;
  while( true ) {
    if (l <= (ulong)length) {
      return true;
    }
    iVar1 = (*strm->_vptr_Stream[5])(strm,d + length,l - length);
    if (extraout_var < 0) break;
    length = CONCAT44(extraout_var,iVar1) + length;
  }
  return false;
}

Assistant:

inline bool write_data(Stream &strm, const char *d, size_t l) {
			size_t offset = 0;
			while (offset < l) {
				auto length = strm.write(d + offset, l - offset);
				if (length < 0) { return false; }
				offset += static_cast<size_t>(length);
			}
			return true;
		}